

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

void preptypeinfo(rnndb *db,rnntypeinfo *ti,char *prefix,rnnvarinfo *vi,int width,char *file)

{
  int iVar1;
  rnnenum *prVar2;
  rnnbitset *prVar3;
  rnnspectype *prVar4;
  rnnvalue **pprVar5;
  rnnvalue *prVar6;
  char *pcVar7;
  rnnbitfield **pprVar8;
  rnnbitfield *prVar9;
  int iVar10;
  long lVar11;
  
  pcVar7 = ti->name;
  if (pcVar7 == (char *)0x0) {
    if (ti->bitfieldsnum == 0) {
      if (ti->valsnum != 0) {
        pcVar7 = strdup("enum");
        ti->name = pcVar7;
LAB_00106f96:
        ti->type = RNN_TTYPE_INLINE_ENUM;
        goto LAB_001070df;
      }
      if (width == 1) {
        pcVar7 = strdup("boolean");
        ti->name = pcVar7;
LAB_00106fe3:
        ti->type = RNN_TTYPE_BOOLEAN;
        goto LAB_001070df;
      }
      pcVar7 = strdup("hex");
      ti->name = pcVar7;
LAB_001070d7:
      ti->type = RNN_TTYPE_HEX;
      goto LAB_001070df;
    }
    pcVar7 = strdup("bitfield");
    ti->name = pcVar7;
  }
  else {
    prVar2 = rnn_findenum(db,pcVar7);
    prVar3 = rnn_findbitset(db,pcVar7);
    prVar4 = rnn_findspectype(db,pcVar7);
    if (prVar2 != (rnnenum *)0x0) {
      if (prVar2->isinline == 0) {
        ti->type = RNN_TTYPE_ENUM;
        ti->eenum = prVar2;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_ENUM;
        if (0 < prVar2->valsnum) {
          iVar10 = ti->valsnum;
          lVar11 = 0;
          do {
            iVar1 = ti->valsmax;
            if (iVar1 <= iVar10) {
              iVar10 = iVar1 * 2;
              if (iVar1 == 0) {
                iVar10 = 0x10;
              }
              ti->valsmax = iVar10;
              pprVar5 = (rnnvalue **)realloc(ti->vals,(long)iVar10 << 3);
              ti->vals = pprVar5;
            }
            prVar6 = copyvalue(prVar2->vals[lVar11],file);
            iVar1 = ti->valsnum;
            iVar10 = iVar1 + 1;
            ti->valsnum = iVar10;
            ti->vals[iVar1] = prVar6;
            lVar11 = lVar11 + 1;
          } while (lVar11 < prVar2->valsnum);
        }
      }
      goto LAB_001070df;
    }
    if (prVar3 != (rnnbitset *)0x0) {
      if (prVar3->isinline == 0) {
        ti->type = RNN_TTYPE_BITSET;
        ti->ebitset = prVar3;
      }
      else {
        ti->type = RNN_TTYPE_INLINE_BITSET;
        if (0 < prVar3->bitfieldsnum) {
          iVar10 = ti->bitfieldsnum;
          lVar11 = 0;
          do {
            iVar1 = ti->bitfieldsmax;
            if (iVar1 <= iVar10) {
              iVar10 = iVar1 * 2;
              if (iVar1 == 0) {
                iVar10 = 0x10;
              }
              ti->bitfieldsmax = iVar10;
              pprVar8 = (rnnbitfield **)realloc(ti->bitfields,(long)iVar10 << 3);
              ti->bitfields = pprVar8;
            }
            prVar9 = copybitfield(prVar3->bitfields[lVar11],file);
            iVar1 = ti->bitfieldsnum;
            iVar10 = iVar1 + 1;
            ti->bitfieldsnum = iVar10;
            ti->bitfields[iVar1] = prVar9;
            lVar11 = lVar11 + 1;
          } while (lVar11 < prVar3->bitfieldsnum);
        }
      }
      goto LAB_001070df;
    }
    if (prVar4 != (rnnspectype *)0x0) {
      ti->type = RNN_TTYPE_SPECTYPE;
      ti->spectype = prVar4;
      goto LAB_001070df;
    }
    iVar10 = strcmp(pcVar7,"hex");
    if (iVar10 == 0) goto LAB_001070d7;
    iVar10 = strcmp(pcVar7,"float");
    if (iVar10 == 0) {
      ti->type = RNN_TTYPE_FLOAT;
      goto LAB_001070df;
    }
    iVar10 = strcmp(pcVar7,"uint");
    if (iVar10 == 0) {
      ti->type = RNN_TTYPE_UINT;
      goto LAB_001070df;
    }
    iVar10 = strcmp(pcVar7,"int");
    if (iVar10 == 0) {
      ti->type = RNN_TTYPE_INT;
      goto LAB_001070df;
    }
    iVar10 = strcmp(pcVar7,"boolean");
    if (iVar10 == 0) goto LAB_00106fe3;
    iVar10 = strcmp(pcVar7,"bitfield");
    if (iVar10 != 0) {
      iVar10 = strcmp(pcVar7,"enum");
      if (iVar10 != 0) {
        iVar10 = strcmp(pcVar7,"fixed");
        if (iVar10 == 0) {
          ti->type = RNN_TTYPE_FIXED;
        }
        else {
          iVar10 = strcmp(pcVar7,"ufixed");
          if (iVar10 == 0) {
            ti->type = RNN_TTYPE_UFIXED;
          }
          else {
            ti->type = RNN_TTYPE_HEX;
            fprintf(_stderr,"%s: unknown type %s\n",prefix,pcVar7);
            db->estatus = 1;
          }
        }
        goto LAB_001070df;
      }
      goto LAB_00106f96;
    }
  }
  ti->type = RNN_TTYPE_INLINE_BITSET;
LAB_001070df:
  if (0 < ti->bitfieldsnum) {
    lVar11 = 0;
    do {
      prepbitfield(db,ti->bitfields[lVar11],prefix,vi);
      lVar11 = lVar11 + 1;
    } while (lVar11 < ti->bitfieldsnum);
  }
  if (0 < ti->valsnum) {
    lVar11 = 0;
    do {
      prepvalue(db,ti->vals[lVar11],prefix,vi);
      lVar11 = lVar11 + 1;
    } while (lVar11 < ti->valsnum);
  }
  return;
}

Assistant:

static void preptypeinfo(struct rnndb *db, struct rnntypeinfo *ti, char *prefix, struct rnnvarinfo *vi, int width, char *file) {
	int i;
	if (ti->name) {
		struct rnnenum *en = rnn_findenum (db, ti->name);
		struct rnnbitset *bs = rnn_findbitset (db, ti->name);
		struct rnnspectype *st = rnn_findspectype (db, ti->name);
		if (en) {
			if (en->isinline) {
				ti->type = RNN_TTYPE_INLINE_ENUM;
				int j;
				for (j = 0; j < en->valsnum; j++)
					ADDARRAY(ti->vals, copyvalue(en->vals[j], file));
			} else {
				ti->type = RNN_TTYPE_ENUM;
				ti->eenum = en;
			}
		} else if (bs) {
			if (bs->isinline) {
				ti->type = RNN_TTYPE_INLINE_BITSET;
				int j;
				for (j = 0; j < bs->bitfieldsnum; j++)
					ADDARRAY(ti->bitfields, copybitfield(bs->bitfields[j], file));
			} else {
				ti->type = RNN_TTYPE_BITSET;
				ti->ebitset = bs;
			}
		} else if (st) {
			ti->type = RNN_TTYPE_SPECTYPE;
			ti->spectype = st;
		} else if (!strcmp(ti->name, "hex")) {
			ti->type = RNN_TTYPE_HEX;
		} else if (!strcmp(ti->name, "float")) {
			ti->type = RNN_TTYPE_FLOAT;
		} else if (!strcmp(ti->name, "uint")) {
			ti->type = RNN_TTYPE_UINT;
		} else if (!strcmp(ti->name, "int")) {
			ti->type = RNN_TTYPE_INT;
		} else if (!strcmp(ti->name, "boolean")) {
			ti->type = RNN_TTYPE_BOOLEAN;
		} else if (!strcmp(ti->name, "bitfield")) {
			ti->type = RNN_TTYPE_INLINE_BITSET;
		} else if (!strcmp(ti->name, "enum")) {
			ti->type = RNN_TTYPE_INLINE_ENUM;
		} else if (!strcmp(ti->name, "fixed")) {
			ti->type = RNN_TTYPE_FIXED;
		} else if (!strcmp(ti->name, "ufixed")) {
			ti->type = RNN_TTYPE_UFIXED;
		} else {
			ti->type = RNN_TTYPE_HEX;
			fprintf (stderr, "%s: unknown type %s\n", prefix, ti->name);
			db->estatus = 1;
		}
	} else if (ti->bitfieldsnum) {
		ti->name = strdup("bitfield");
		ti->type = RNN_TTYPE_INLINE_BITSET;
	} else if (ti->valsnum) {
		ti->name = strdup("enum");
		ti->type = RNN_TTYPE_INLINE_ENUM;
	} else if (width == 1) {
		ti->name = strdup("boolean");
		ti->type = RNN_TTYPE_BOOLEAN;
	} else {
		ti->name = strdup("hex");
		ti->type = RNN_TTYPE_HEX;
	}
	for (i = 0; i < ti->bitfieldsnum; i++)
		prepbitfield(db,  ti->bitfields[i], prefix, vi);
	for (i = 0; i < ti->valsnum; i++)
		prepvalue(db, ti->vals[i], prefix, vi);
}